

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O0

void file_unlock(ang_file *f)

{
  int __fd;
  undefined2 local_30;
  undefined2 local_2e;
  flock lock;
  ang_file *f_local;
  
  local_30 = 2;
  local_2e = 0;
  lock.l_type = 0;
  lock.l_whence = 0;
  lock._4_4_ = 0;
  lock.l_start = 0;
  lock.l_len._0_4_ = 0;
  lock._24_8_ = f;
  __fd = fileno((FILE *)f->fh);
  fcntl(__fd,6,&local_30);
  return;
}

Assistant:

void file_unlock(ang_file *f)
{
#if defined(HAVE_FCNTL_H) && defined(UNIX)
	struct flock lock;
	lock.l_type = F_UNLCK;
	lock.l_whence = SEEK_SET;
	lock.l_start = 0;
	lock.l_len = 0;
	lock.l_pid = 0;
	fcntl(fileno(f->fh), F_SETLK, &lock);
#endif /* HAVE_FCNTL_H && UNIX */
}